

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# belt_cbc.c
# Opt level: O0

void beltCBCStepD(void *buf,size_t count,void *state)

{
  u32 *in_RDX;
  ulong in_RSI;
  ulong *in_RDI;
  belt_cbc_st *st;
  ulong local_10;
  ulong *local_8;
  
  local_8 = in_RDI;
  for (local_10 = in_RSI; 0x1f < local_10 || local_10 == 0x10; local_10 = local_10 - 0x10) {
    *(ulong *)(in_RDX + 0xc) = *local_8;
    *(ulong *)(in_RDX + 0xe) = local_8[1];
    beltBlockDecr((octet *)local_8,in_RDX);
    *local_8 = *(ulong *)(in_RDX + 8) ^ *local_8;
    local_8[1] = *(ulong *)(in_RDX + 10) ^ local_8[1];
    *(undefined8 *)(in_RDX + 8) = *(undefined8 *)(in_RDX + 0xc);
    *(undefined8 *)(in_RDX + 10) = *(undefined8 *)(in_RDX + 0xe);
    local_8 = local_8 + 2;
  }
  if (local_10 != 0) {
    beltBlockDecr((octet *)local_8,in_RDX);
    memSwap(local_8,local_8 + 2,local_10 - 0x10);
    memXor2(local_8 + 2,local_8,local_10 - 0x10);
    beltBlockDecr((octet *)local_8,in_RDX);
    *local_8 = *(ulong *)(in_RDX + 8) ^ *local_8;
    local_8[1] = *(ulong *)(in_RDX + 10) ^ local_8[1];
  }
  return;
}

Assistant:

void beltCBCStepD(void* buf, size_t count, void* state)
{
	belt_cbc_st* st = (belt_cbc_st*)state;
	ASSERT(count >= 16);
	ASSERT(memIsDisjoint2(buf, count, state, beltCBC_keep()));
	// цикл по полным блокам
	while(count >= 32 || count == 16)
	{
		beltBlockCopy(st->block2, buf);
		beltBlockDecr(buf, st->key);
		beltBlockXor2(buf, st->block);
		beltBlockCopy(st->block, st->block2);
		buf = (octet*)buf + 16;
		count -= 16;
	}
	// неполный блок? кража блока
	if (count)
	{
		ASSERT(16 < count && count < 32);
		beltBlockDecr(buf, st->key);
		memSwap(buf, (octet*)buf + 16, count - 16);
		memXor2((octet*)buf + 16, buf, count - 16);
		beltBlockDecr(buf, st->key);
		beltBlockXor2(buf, st->block);
	}
}